

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O0

listelem_alloc_t * listelem_alloc_init(size_t elemsize)

{
  undefined1 auVar1 [16];
  size_t rounded;
  listelem_alloc_t *list;
  size_t elemsize_local;
  
  list = (listelem_alloc_t *)elemsize;
  if ((elemsize & 7) != 0) {
    list = (listelem_alloc_t *)(elemsize + 7 & 0xfffffffffffffff8);
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
            ,0x61,"List item size (%lu) not multiple of sizeof(void *), rounding to %lu\n",elemsize,
            list);
  }
  elemsize_local =
       (size_t)__ckd_calloc__(1,0x40,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
                              ,100);
  ((listelem_alloc_t *)elemsize_local)->freelist = (char **)0x0;
  ((listelem_alloc_t *)elemsize_local)->blocks = (glist_t)0x0;
  ((listelem_alloc_t *)elemsize_local)->elemsize = (size_t)list;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)list * 0x32;
  ((listelem_alloc_t *)elemsize_local)->blk_alloc =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000)) / auVar1,0);
  if (((listelem_alloc_t *)elemsize_local)->blk_alloc == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
            ,0x6d,"Element size * block size exceeds 256k, use malloc instead.\n");
    ckd_free((void *)elemsize_local);
    elemsize_local = 0;
  }
  else {
    ((listelem_alloc_t *)elemsize_local)->n_alloc = 0;
    ((listelem_alloc_t *)elemsize_local)->n_freed = 0;
    listelem_add_block((listelem_alloc_t *)elemsize_local,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
                       ,0x75);
  }
  return (listelem_alloc_t *)elemsize_local;
}

Assistant:

listelem_alloc_t *
listelem_alloc_init(size_t elemsize)
{
    listelem_alloc_t *list;

    if ((elemsize % sizeof(void *)) != 0) {
        size_t rounded = (elemsize + sizeof(void *) - 1) & ~(sizeof(void *)-1);
        E_WARN
            ("List item size (%lu) not multiple of sizeof(void *), rounding to %lu\n",
             (unsigned long)elemsize,
             (unsigned long)rounded);
        elemsize = rounded;
    }
    list = ckd_calloc(1, sizeof(*list));
    list->freelist = NULL;
    list->blocks = NULL;
    list->elemsize = elemsize;
    /* Intent of this is to increase block size once we allocate
     * 256KiB (i.e. 1<<18). If somehow the element size is big enough
     * to overflow that, just fail, people should use malloc anyway. */
    list->blk_alloc = (1 << 18) / (MIN_ALLOC * elemsize);
    if (list->blk_alloc <= 0) {
        E_ERROR("Element size * block size exceeds 256k, use malloc instead.\n");
        ckd_free(list);
        return NULL;
    }
    list->n_alloc = 0;
    list->n_freed = 0;

    /* Allocate an initial block to minimize latency. */
    listelem_add_block(list, __FILE__, __LINE__);
    return list;
}